

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,3>
          (tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [32];
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  __m128i x;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  __m256 Cv [3] [3];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  auVar19 = _DAT_0016a9c0;
  lVar11 = (n - n0) / 3;
  lVar18 = ((m - m0) / 3) * lVar11;
  lVar12 = (lVar18 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  lVar14 = *(int *)(this + 0x38) * lVar12;
  lVar12 = lVar12 + lVar14;
  if (lVar18 <= lVar12) {
    lVar12 = lVar18;
  }
  if (lVar14 < lVar12) {
    lVar18 = *(long *)this;
    lVar4 = *(long *)(this + 8);
    auVar20._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar20._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar20._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar20._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar21._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar21._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar21._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar21._24_8_ = 0xf0f0f0f0f0f0f0f0;
    lVar5 = *(long *)(this + 0x30);
    lVar6 = *(long *)(this + 0x18);
    lVar7 = *(long *)(this + 0x28);
    auVar10 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    lVar8 = *(long *)(this + 0x20);
    lVar9 = *(long *)(this + 0x10);
    do {
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      local_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      local_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      uStack_1a8 = 0;
      uStack_1a0 = 0;
      uStack_198 = 0;
      uStack_190 = 0;
      uStack_188 = 0;
      lVar15 = (lVar14 % lVar11) * 3 + n0;
      if (0 < lVar6) {
        lVar18 = ((lVar14 / lVar11) * 3 + m0) * lVar8 * 0x16 + lVar18;
        auVar3 = *(undefined1 (*) [16])(lVar18 + 6);
        auVar24 = vpsrlw_avx(auVar3,4);
        auVar23._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
        auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
        auVar19 = vpermb_avx512vl(auVar19,ZEXT432(*(uint *)(lVar18 + 2)));
        auVar19 = vpor_avx2(auVar19,auVar20);
        auVar19 = vpcmpeqb_avx2(auVar19,auVar10);
        auVar19 = vpternlogq_avx512vl(auVar19,auVar19,auVar19,0xf);
        auVar19 = vpternlogq_avx512vl(auVar19,auVar23,auVar21,0xe4);
        vpsignb_avx2(auVar19,auVar19);
        vpsignb_avx2(*(undefined1 (*) [32])(lVar4 + 2 + lVar15 * lVar7 * 0x22),auVar19);
        halt_baddata();
      }
      puVar13 = &local_1c0;
      lVar15 = lVar15 * lVar5 * 4 + (lVar14 / lVar11) * 0xc + m0 * 4 + lVar9;
      lVar16 = 0;
      do {
        lVar17 = 0;
        do {
          pfVar2 = (float *)(puVar13 + lVar17 + 2);
          pfVar1 = (float *)(puVar13 + lVar17);
          auVar24._0_4_ = *pfVar2 + *pfVar1;
          auVar24._4_4_ = pfVar2[1] + pfVar1[1];
          auVar24._8_4_ = pfVar2[2] + pfVar1[2];
          auVar24._12_4_ = pfVar2[3] + pfVar1[3];
          auVar3 = vshufpd_avx(auVar24,auVar24,1);
          auVar22._0_4_ = auVar24._0_4_ + auVar3._0_4_;
          auVar22._4_4_ = auVar24._4_4_ + auVar3._4_4_;
          auVar22._8_4_ = auVar24._8_4_ + auVar3._8_4_;
          auVar22._12_4_ = auVar24._12_4_ + auVar3._12_4_;
          auVar3 = vhaddps_avx(auVar22,auVar22);
          *(int *)(lVar15 + lVar17) = auVar3._0_4_;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0xc);
        lVar16 = lVar16 + 1;
        puVar13 = puVar13 + 0xc;
        lVar15 = lVar15 + lVar5 * 4;
      } while (lVar16 != 3);
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar12);
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }